

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

FillerParameter * __thiscall
caffe::RecurrentParameter::mutable_bias_filler(RecurrentParameter *this)

{
  FillerParameter *this_00;
  RecurrentParameter *this_local;
  
  set_has_bias_filler(this);
  if (this->bias_filler_ == (FillerParameter *)0x0) {
    this_00 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(this_00);
    this->bias_filler_ = this_00;
  }
  return this->bias_filler_;
}

Assistant:

inline ::caffe::FillerParameter* RecurrentParameter::mutable_bias_filler() {
  set_has_bias_filler();
  if (bias_filler_ == NULL) {
    bias_filler_ = new ::caffe::FillerParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.RecurrentParameter.bias_filler)
  return bias_filler_;
}